

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::ForceSweepObject(Recycler *this)

{
  bool bVar1;
  ConfigFlagsTable *pCVar2;
  Recycler *this_local;
  
  bVar1 = BinaryFeatureControl::RecyclerTest();
  if ((bVar1) && (this->checkFn != (_func_BOOL_char_ptr_size_t *)0x0)) {
    this_local._7_1_ = true;
  }
  else if (this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) {
    pCVar2 = GetRecyclerFlagsTable(this);
    bVar1 = Js::Phases::IsEnabled(&pCVar2->Stats,RecyclerPhase);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else if ((this->enableScanImplicitRoots & 1U) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool
Recycler::ForceSweepObject()
{
#ifdef RECYCLER_TEST_SUPPORT
    if (BinaryFeatureControl::RecyclerTest())
    {
        if (checkFn != nullptr)
        {
            return true;
        }
    }
#endif

#ifdef PROFILE_RECYCLER_ALLOC
    if (trackerDictionary != nullptr)
    {
        // Need to sweep object if we are tracing recycler allocs
        return true;
    }
#endif

#ifdef RECYCLER_STATS
    if (CUSTOM_PHASE_STATS1(this->GetRecyclerFlagsTable(), Js::RecyclerPhase))
    {
        return true;
    }
#endif

#if DBG
    // Force sweeping the object so we can assert that we are not sweeping objects that are still implicit roots
    if (this->enableScanImplicitRoots)
    {
        return true;
    }
#endif
    return false;
}